

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

void __thiscall Bstrlib::CBString::join(CBString *this,CBStringList *l)

{
  int *piVar1;
  CBStringException *pCVar2;
  long lVar3;
  int len;
  long lVar4;
  ulong uVar5;
  CBStringException bstr__cppwrapper_exception;
  CBStringException local_b0;
  string local_88;
  string local_68;
  string local_48;
  
  if ((this->super_tagbstring).mlen < 1) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"CBString::Write protection error","");
    CBStringException::CBStringException(&local_b0,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,&local_b0);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  lVar3 = *(long *)(l + 8) - *(long *)l;
  if (lVar3 == 0) {
    len = 1;
  }
  else {
    lVar3 = (lVar3 >> 3) * -0x5555555555555555;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    piVar1 = (int *)(*(long *)l + 0xc);
    len = 1;
    do {
      len = len + *piVar1;
      if (len < 0) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"CBString::Failure in (CBStringList) constructor, too long",
                   "");
        CBStringException::CBStringException(&local_b0,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
        CBStringException::CBStringException(pCVar2,&local_b0);
        __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
      }
      piVar1 = piVar1 + 6;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  alloc(this,len);
  (this->super_tagbstring).slen = 0;
  if ((this->super_tagbstring).data == (uchar *)0x0) {
    (this->super_tagbstring).mlen = 0;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"CBString::Failure in (CBStringList) constructor","");
    CBStringException::CBStringException(&local_b0,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,&local_b0);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  lVar3 = *(long *)l;
  if (*(long *)(l + 8) != lVar3) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      operator+=(this,(CBString *)(lVar3 + lVar4));
      uVar5 = uVar5 + 1;
      lVar3 = *(long *)l;
      lVar4 = lVar4 + 0x18;
    } while (uVar5 < (ulong)((*(long *)(l + 8) - lVar3 >> 3) * -0x5555555555555555));
  }
  return;
}

Assistant:

void CBString::join (const struct CBStringList& l) {
int c;
size_t i;

	if (mlen <= 0) {
		bstringThrow ("Write protection error");
	}

	for (c=1, i=0; i < l.size(); i++) {
		c += l.at(i).slen;
		if (c < 0) bstringThrow ("Failure in (CBStringList) constructor, too long");
	}

	alloc (c);
	slen = 0;
	if (!data) {
		mlen = slen = 0;
		bstringThrow ("Failure in (CBStringList) constructor");
	} else {
		for (i=0; i < l.size(); i++) {
			*this += l.at(i);
		}
	}
}